

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLog.c
# Opt level: O3

int Abc_NtkReadLogFile(char *pFileName,Abc_Cex_t **ppCex,int *pnFrames)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  FILE *__stream;
  Abc_Cex_t *p;
  int *piVar5;
  Abc_Cex_t *__ptr;
  int nFrames;
  ulong uVar6;
  char *pcVar7;
  ulong uVar8;
  int iVar9;
  char Buffer [1000];
  int local_42c;
  undefined4 local_418;
  undefined4 uStack_414;
  char local_410;
  char local_40f [991];
  
  __stream = fopen(pFileName,"r");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open log file for reading \"%s\".\n",pFileName);
    return -1;
  }
  fgets((char *)&local_418,1000,__stream);
  if (local_410 == 'T' && CONCAT44(uStack_414,local_418) == 0x41534e555f6c6e73) {
    iVar2 = atoi(local_40f);
    iVar9 = 1;
LAB_00273cf9:
    local_42c = -1;
    iVar1 = -1;
  }
  else {
    if (CONCAT31((undefined3)uStack_414,local_418._3_1_) != 0x5441535f || local_418 != 0x5f6c6e73) {
      if (CONCAT31((undefined3)uStack_414,local_418._3_1_) == 0x4b4e555f && local_418 == 0x5f6c6e73)
      {
        iVar2 = atoi((char *)((long)&uStack_414 + 3));
      }
      else {
        puts("Unrecognized status.");
        iVar2 = -1;
      }
      iVar9 = -1;
      goto LAB_00273cf9;
    }
    pcVar7 = strtok((char *)((long)&uStack_414 + 3)," \t\n");
    iVar2 = atoi(pcVar7);
    iVar9 = 0;
    strtok((char *)0x0," \t\n");
    pcVar7 = strtok((char *)0x0," \t\n");
    iVar1 = -1;
    if (pcVar7 == (char *)0x0) {
      local_42c = -1;
    }
    else {
      local_42c = atoi(pcVar7);
      pcVar7 = strtok((char *)0x0," \t\n");
      iVar9 = 0;
      if (pcVar7 != (char *)0x0) {
        iVar1 = atoi(pcVar7);
        iVar9 = 0;
      }
    }
  }
  p = (Abc_Cex_t *)malloc(0x10);
  p->iPo = 100;
  p->iFrame = 0;
  piVar5 = (int *)malloc(400);
  *(int **)&p->nRegs = piVar5;
  while ((uVar3 = fgetc(__stream), uVar3 != 0xffffffff && (uVar3 != 10))) {
    if ((uVar3 & 0xfffffffe) == 0x30) {
      Vec_IntPush((Vec_Int_t *)p,uVar3 - 0x30);
    }
  }
  uVar3 = p->iFrame;
  while (uVar4 = fgetc(__stream), uVar4 != 0xffffffff) {
    if ((uVar4 & 0xfffffffe) == 0x30) {
      Vec_IntPush((Vec_Int_t *)p,uVar4 - 0x30);
    }
  }
  fclose(__stream);
  uVar4 = p->iFrame;
  uVar8 = (ulong)uVar4;
  if (uVar8 == 0) {
    __ptr = p;
    if (*(int **)&p->nRegs != (int *)0x0) {
      free(*(int **)&p->nRegs);
    }
  }
  else {
    if (iVar1 == -1) {
      iVar1 = iVar2;
    }
    if ((int)uVar3 < 0) {
      pcVar7 = "Cannot read register number.";
LAB_00273de5:
      puts(pcVar7);
      if (*(int **)&p->nRegs != (int *)0x0) {
        free(*(int **)&p->nRegs);
      }
      free(p);
      return -1;
    }
    if (uVar4 == uVar3) {
      pcVar7 = "Cannot read counter example.";
      goto LAB_00273de5;
    }
    nFrames = iVar1 + 1;
    if ((int)(uVar4 - uVar3) % nFrames != 0) {
      pcVar7 = "Incorrect number of bits.";
      goto LAB_00273de5;
    }
    __ptr = Abc_CexAlloc(uVar3,(int)(uVar4 - uVar3) / nFrames,nFrames);
    __ptr->iPo = local_42c;
    __ptr->iFrame = iVar1;
    if (uVar4 != __ptr->nBits) {
      __assert_fail("Vec_IntSize(vNums) == pCex->nBits",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcLog.c"
                    ,0xdb,"int Abc_NtkReadLogFile(char *, Abc_Cex_t **, int *)");
    }
    if ((int)uVar4 < 1) {
      piVar5 = *(int **)&p->nRegs;
      if (piVar5 != (int *)0x0) goto LAB_00273e8a;
    }
    else {
      piVar5 = *(int **)&p->nRegs;
      uVar6 = 0;
      do {
        if (uVar8 == uVar6) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (piVar5[uVar6] != 0) {
          (&__ptr[1].iPo)[uVar6 >> 5] = (&__ptr[1].iPo)[uVar6 >> 5] | 1 << ((byte)uVar6 & 0x1f);
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < uVar8);
LAB_00273e8a:
      free(piVar5);
    }
    free(p);
    if (ppCex != (Abc_Cex_t **)0x0) {
      *ppCex = __ptr;
      goto LAB_00273db7;
    }
  }
  free(__ptr);
LAB_00273db7:
  if (pnFrames != (int *)0x0) {
    *pnFrames = iVar2;
    return iVar9;
  }
  return iVar9;
}

Assistant:

int Abc_NtkReadLogFile( char * pFileName, Abc_Cex_t ** ppCex, int * pnFrames )
{
    FILE * pFile;
    Abc_Cex_t * pCex;
    Vec_Int_t * vNums;
    char Buffer[1000], * pToken, * RetValue;
    int c, nRegs = -1, nFrames = -1, iPo = -1, Status = -1, nFrames2 = -1;
    pFile = fopen( pFileName, "r" );
    if ( pFile == NULL )
    {
        printf( "Cannot open log file for reading \"%s\".\n" , pFileName );
        return -1;
    }
    RetValue = fgets( Buffer, 1000, pFile );
    if ( !strncmp( Buffer, "snl_UNSAT", strlen("snl_UNSAT") ) )
    {
        Status = 1;
        nFrames = atoi( Buffer + strlen("snl_UNSAT") ); 
    }
    else if ( !strncmp( Buffer, "snl_SAT", strlen("snl_SAT") ) )
    {
        Status = 0;
//        nFrames = atoi( Buffer + strlen("snl_SAT") ); 
        pToken  = strtok( Buffer + strlen("snl_SAT"), " \t\n" );
        nFrames = atoi( pToken ); 
        pToken  = strtok( NULL, " \t\n" );
        pToken  = strtok( NULL, " \t\n" );
        if ( pToken != NULL )
        {
            iPo     = atoi( pToken ); 
            pToken  = strtok( NULL, " \t\n" );
            if ( pToken )
                nFrames2 = atoi( pToken ); 
        }
//        else
//            printf( "Warning! The current status is SAT but the current CEX is not given.\n"  );
    }
    else if ( !strncmp( Buffer, "snl_UNK", strlen("snl_UNK") ) )
    {
        Status = -1;
        nFrames = atoi( Buffer + strlen("snl_UNK") ); 
    }
    else
    {
        printf( "Unrecognized status.\n" );
    }
    // found regs till the new line
    vNums = Vec_IntAlloc( 100 );
    while ( (c = fgetc(pFile)) != EOF )
    {
        if ( c == '\n' )
            break;
        if ( c == '0' || c == '1' )
            Vec_IntPush( vNums, c - '0' );
    }
    nRegs = Vec_IntSize(vNums);
    // skip till the new line
    while ( (c = fgetc(pFile)) != EOF )
    {
        if ( c == '0' || c == '1' )
            Vec_IntPush( vNums, c - '0' );
    }
    fclose( pFile );
    if ( Vec_IntSize(vNums) )
    {
        int iFrameCex = (nFrames2 == -1) ? nFrames : nFrames2;
        if ( nRegs < 0 )
        {
            printf( "Cannot read register number.\n" );
            Vec_IntFree( vNums );
            return -1;
        }
        if ( Vec_IntSize(vNums)-nRegs == 0 )
        {
            printf( "Cannot read counter example.\n" );
            Vec_IntFree( vNums );
            return -1;
        }
        if ( (Vec_IntSize(vNums)-nRegs) % (iFrameCex + 1) != 0 )
        {
            printf( "Incorrect number of bits.\n" );
            Vec_IntFree( vNums );
            return -1;
        }
        pCex = Abc_CexAlloc( nRegs, (Vec_IntSize(vNums)-nRegs)/(iFrameCex + 1), iFrameCex + 1 );
        pCex->iPo    = iPo;
        pCex->iFrame = iFrameCex;
        assert( Vec_IntSize(vNums) == pCex->nBits );
        for ( c = 0; c < pCex->nBits; c++ )
            if ( Vec_IntEntry(vNums, c) )
                Abc_InfoSetBit( pCex->pData, c );
        Vec_IntFree( vNums );
        if ( ppCex )
            *ppCex = pCex;
        else
            ABC_FREE( pCex );
    }
    else
        Vec_IntFree( vNums );
    if ( pnFrames )
        *pnFrames = nFrames;
    return Status;
}